

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall kj::HttpHeaders::HttpHeaders(HttpHeaders *this,HttpHeaderTable *table)

{
  StringPtr *pSVar1;
  ulong elementCount;
  
  this->table = table;
  elementCount = (ulong)((long)(table->namesById).builder.pos - (long)(table->namesById).builder.ptr
                        ) >> 4 & 0xffffffff;
  pSVar1 = (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,elementCount,elementCount,
                      _::HeapArrayDisposer::Allocate_<kj::StringPtr,_false,_false>::construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringPtr,_false,_false>::destruct);
  (this->indexedHeaders).ptr = pSVar1;
  (this->indexedHeaders).size_ = elementCount;
  (this->indexedHeaders).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  (this->unindexedHeaders).builder.ptr = (Header *)0x0;
  (this->unindexedHeaders).builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
  (this->unindexedHeaders).builder.endPtr = (Header *)0x0;
  (this->ownedStrings).builder.ptr = (Array<char> *)0x0;
  (this->ownedStrings).builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
  (this->ownedStrings).builder.endPtr = (Array<char> *)0x0;
  return;
}

Assistant:

HttpHeaders::HttpHeaders(const HttpHeaderTable& table)
    : table(&table),
      indexedHeaders(kj::heapArray<kj::StringPtr>(table.idCount())) {}